

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O1

void duckdb::GenerateUUIDv7Function(DataChunk *args,ExpressionState *state,Vector *result)

{
  optional_ptr<duckdb::FunctionLocalState,_true> oVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  optional_ptr<duckdb::FunctionLocalState,_true> local_28;
  
  local_28.ptr = *(FunctionLocalState **)(state + 0xb0);
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid(&local_28);
  oVar1.ptr = local_28.ptr;
  duckdb::Vector::SetVectorType((VectorType)result);
  if (*(long *)(args + 0x18) != 0) {
    puVar3 = (undefined8 *)(*(long *)(result + 0x20) + 8);
    uVar2 = 0;
    do {
      auVar4 = duckdb::UUIDv7::GenerateRandomUUID((RandomEngine *)(oVar1.ptr + 8));
      puVar3[-1] = auVar4._0_8_;
      *puVar3 = auVar4._8_8_;
      uVar2 = uVar2 + 1;
      puVar3 = puVar3 + 2;
    } while (uVar2 < *(ulong *)(args + 0x18));
  }
  return;
}

Assistant:

static void GenerateUUIDv7Function(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 0);
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<RandomLocalState>();

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<hugeint_t>(result);

	for (idx_t i = 0; i < args.size(); i++) {
		result_data[i] = UUIDv7::GenerateRandomUUID(lstate.random_engine);
	}
}